

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O1

int iemgui_getcolorarg(int index,int argc,t_atom *argv)

{
  char cVar1;
  t_symbol *ptVar2;
  long lVar3;
  t_float tVar4;
  
  if (index < argc) {
    if (argv[(uint)index].a_type == A_SYMBOL) {
      ptVar2 = atom_getsymbolarg(index,argc,argv);
      cVar1 = *ptVar2->s_name;
      if (cVar1 == '#') {
        lVar3 = strtol(ptVar2->s_name + 1,(char **)0x0,0x10);
        ptVar2 = (t_symbol *)(ulong)((uint)lVar3 & 0xffffff);
      }
      if (cVar1 == '#') {
        return (int)ptVar2;
      }
    }
    else if (argv[(uint)index].a_type == A_FLOAT) {
      tVar4 = atom_getfloatarg(index,argc,argv);
      return (int)tVar4;
    }
  }
  return 0;
}

Assistant:

static int iemgui_getcolorarg(int index, int argc, t_atom*argv)
{
    if(index < 0 || index >= argc)
        return 0;
    if(IS_A_FLOAT(argv,index))
        return atom_getfloatarg(index, argc, argv);
    if(IS_A_SYMBOL(argv,index))
    {
        t_symbol*s=atom_getsymbolarg(index, argc, argv);
        if ('#' == s->s_name[0])
        {
            int col = (int)strtol(s->s_name+1, 0, 16);
            return col & 0xFFFFFF;
        }
    }
    return 0;
}